

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadDrawModeCase::iterate(BadDrawModeCase *this)

{
  RenderContext *renderCtx;
  deUint32 dVar1;
  deUint32 err;
  ProgramSources *pPVar2;
  char *description;
  deUint32 mode;
  deUint32 type;
  bool bVar3;
  deUint32 cmdBufferID;
  allocator<char> local_4b1;
  deUint16 indices [3];
  deUint32 indexBufferID;
  deUint32 dataBufferID;
  deUint32 vaoID;
  string local_460 [32];
  undefined1 local_440 [8];
  deUint32 local_438;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  GLContext gl;
  undefined1 local_278 [8];
  pointer pbStack_270;
  undefined4 local_268;
  pointer local_1c8;
  undefined1 uStack_1c0;
  undefined7 uStack_1bf;
  undefined1 uStack_1b8;
  undefined8 uStack_1b7;
  ShaderProgram program;
  
  local_418 = 0;
  uStack_410 = 0x3f80000000000000;
  local_408 = 0x3f800000;
  uStack_400 = 0x3f80000000000000;
  local_3f8 = 0x3f80000000000000;
  uStack_3f0 = 0x3f80000000000000;
  indices[2] = 1;
  indices[0] = 0;
  indices[1] = 2;
  local_278 = (undefined1  [8])0x0;
  pbStack_270 = (pointer)&DAT_100000001;
  sglr::GLContext::GLContext
            (&gl,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,1,
             (IVec4 *)local_278);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_278,0,0xac);
  local_1c8 = (pointer)0x0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  uStack_1b8 = 0;
  uStack_1b7 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataBufferID,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)&cmdBufferID);
  glu::VertexSource::VertexSource((VertexSource *)local_440,(string *)&dataBufferID);
  pPVar2 = glu::ProgramSources::operator<<((ProgramSources *)local_278,(ShaderSource *)local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indexBufferID,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_4b1);
  glu::FragmentSource::FragmentSource((FragmentSource *)&vaoID,(string *)&indexBufferID);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)&vaoID);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar2);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string((string *)&indexBufferID);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&dataBufferID);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_278);
  vaoID = 0;
  dataBufferID = 0;
  indexBufferID = 0;
  cmdBufferID = 0;
  dVar1 = sglr::GLContext::getAttribLocation(&gl,program.m_program.m_program,"a_position");
  bVar3 = this->m_drawType != DRAW_ELEMENTS_BAD_INDEX;
  mode = 4;
  if (bVar3) {
    mode = 0x123;
  }
  type = 0x1403;
  if (!bVar3) {
    type = 0x123;
  }
  err = sglr::GLContext::getError(&gl);
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0xa45);
  sglr::GLContext::genVertexArrays(&gl,1,&vaoID);
  sglr::GLContext::bindVertexArray(&gl,vaoID);
  sglr::GLContext::genBuffers(&gl,1,&dataBufferID);
  sglr::GLContext::bindBuffer(&gl,0x8892,dataBufferID);
  sglr::GLContext::bufferData(&gl,0x8892,0x30,&local_418,0x88e4);
  sglr::GLContext::vertexAttribPointer(&gl,dVar1,4,0x1406,0,0,(void *)0x0);
  sglr::GLContext::enableVertexAttribArray(&gl,dVar1);
  dVar1 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar1,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0xa53);
  if (this->m_drawType - DRAW_ELEMENTS < 2) {
    sglr::GLContext::genBuffers(&gl,1,&indexBufferID);
    sglr::GLContext::bindBuffer(&gl,0x8893,indexBufferID);
    sglr::GLContext::bufferData(&gl,0x8893,6,indices,0x88e4);
    dVar1 = sglr::GLContext::getError(&gl);
    glu::checkError(dVar1,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0xa5c);
  }
  sglr::GLContext::genBuffers(&gl,1,&cmdBufferID);
  sglr::GLContext::bindBuffer(&gl,0x8f3f,cmdBufferID);
  if (this->m_drawType - DRAW_ELEMENTS < 2) {
    local_278 = (undefined1  [8])0x100000003;
    pbStack_270 = (pointer)0x0;
    local_268 = 0;
    sglr::GLContext::bufferData(&gl,0x8f3f,0x14,local_278,0x88e4);
  }
  else if (this->m_drawType == DRAW_ARRAYS) {
    local_278 = (undefined1  [8])0x100000003;
    pbStack_270 = (pointer)0x0;
    sglr::GLContext::bufferData(&gl,0x8f3f,0x10,local_278,0x88e4);
  }
  dVar1 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar1,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0xa7a);
  sglr::GLContext::viewport(&gl,0,0,1,1);
  sglr::GLContext::useProgram(&gl,program.m_program.m_program);
  if (this->m_drawType - DRAW_ELEMENTS < 2) {
    sglr::GLContext::drawElementsIndirect(&gl,mode,type,(void *)0x0);
  }
  else if (this->m_drawType == DRAW_ARRAYS) {
    sglr::GLContext::drawArraysIndirect(&gl,mode,(void *)0x0);
  }
  dVar1 = sglr::GLContext::getError(&gl);
  sglr::GLContext::useProgram(&gl,0);
  if (dVar1 != 0x500) {
    local_278 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_270);
    std::operator<<((ostream *)&pbStack_270,"Unexpected error. Expected GL_INVALID_ENUM, got ");
    local_440 = (undefined1  [8])glu::getErrorName;
    local_438 = dVar1;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_440,(ostream *)&pbStack_270);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_270);
    description = "Got unexpected error.";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(dVar1 != 0x500),
             description);
  glu::ShaderProgram::~ShaderProgram(&program);
  sglr::GLContext::~GLContext(&gl);
  return STOP;
}

Assistant:

BadDrawModeCase::IterateResult BadDrawModeCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	sglr::GLContext		gl				(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32			error;
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			vaoID			= 0;
	deUint32			dataBufferID	= 0;
	deUint32			indexBufferID	= 0;
	deUint32			cmdBufferID		= 0;

	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.getAttribLocation(programID, "a_position");
	const glw::GLenum	mode			= (m_drawType == DRAW_ELEMENTS_BAD_INDEX) ? (GL_TRIANGLES) : (0x123);
	const glw::GLenum	indexType		= (m_drawType == DRAW_ELEMENTS_BAD_INDEX) ? (0x123) : (GL_UNSIGNED_SHORT);

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	// vao

	gl.genVertexArrays(1, &vaoID);
	gl.bindVertexArray(vaoID);

	// va

	gl.genBuffers(1, &dataBufferID);
	gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	// index

	if (m_drawType == DRAW_ELEMENTS || m_drawType == DRAW_ELEMENTS_BAD_INDEX)
	{
		gl.genBuffers(1, &indexBufferID);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBufferID);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}

	// cmd

	gl.genBuffers(1, &cmdBufferID);
	gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, cmdBufferID);
	if (m_drawType == DRAW_ELEMENTS || m_drawType == DRAW_ELEMENTS_BAD_INDEX)
	{
		DrawElementsCommand drawCommand;
		drawCommand.count				= 3;
		drawCommand.primCount			= 1;
		drawCommand.firstIndex			= 0;
		drawCommand.baseVertex			= 0;
		drawCommand.reservedMustBeZero	= 0;

		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
	}
	else if (m_drawType == DRAW_ARRAYS)
	{
		DrawArraysCommand drawCommand;
		drawCommand.count				= 3;
		drawCommand.primCount			= 1;
		drawCommand.first				= 0;
		drawCommand.reservedMustBeZero	= 0;

		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
	}
	else
		DE_ASSERT(DE_FALSE);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.viewport(0, 0, 1, 1);
	gl.useProgram(programID);
	if (m_drawType == DRAW_ELEMENTS || m_drawType == DRAW_ELEMENTS_BAD_INDEX)
		gl.drawElementsIndirect(mode, indexType, DE_NULL);
	else if (m_drawType == DRAW_ARRAYS)
		gl.drawArraysIndirect(mode, DE_NULL);
	else
		DE_ASSERT(DE_FALSE);

	error = gl.getError();
	gl.useProgram(0);

	if (error == GL_INVALID_ENUM)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected error. Expected GL_INVALID_ENUM, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}